

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Appearance_PDU.cpp
# Opt level: O1

void __thiscall
KDIS::PDU::Appearance_PDU::Decode(Appearance_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  anon_union_1_2_647d7bf6_for_m_AppearanceFlag1Union *V;
  anon_union_1_2_647d7bf6_for_m_AppearanceFlag2Union *V_00;
  KUINT16 KVar1;
  KException *this_00;
  int iVar2;
  undefined7 in_register_00000011;
  KString local_48;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  iVar2 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar2 = 0;
  }
  if (iVar2 + (uint)KVar1 < 0x11) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Decode","");
    KException::KException(this_00,&local_48,2);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  LE_Header::Decode(&this->super_LE_Header,stream,ignoreHeader);
  V = &this->m_AppearanceFlag1Union;
  this->m_AppearanceFlag1Union = (anon_union_1_2_647d7bf6_for_m_AppearanceFlag1Union)0x0;
  this->m_AppearanceFlag2Union = (anon_union_1_2_647d7bf6_for_m_AppearanceFlag2Union)0x0;
  V_00 = &this->m_AppearanceFlag2Union;
  KDataStream::Read(stream,&V->m_ui8Flag);
  if ((char)(this->m_AppearanceFlag1Union).m_ui8Flag < '\0') {
    KDataStream::Read(stream,&V_00->m_ui8Flag);
  }
  if ((V->m_ui8Flag & 1) != 0) {
    KDataStream::Read(stream,&this->m_ui8ForceID);
  }
  if ((V->m_ui8Flag & 2) != 0) {
    (*(this->m_EntityType).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_EntityType,stream);
  }
  if ((V->m_ui8Flag & 4) != 0) {
    (*(this->m_AltEntityType).super_DataTypeBase._vptr_DataTypeBase[3])
              (&this->m_AltEntityType,stream);
  }
  if ((V->m_ui8Flag & 8) != 0) {
    (*(this->m_EntityMarking).super_DataTypeBase._vptr_DataTypeBase[3])
              (&this->m_EntityMarking,stream);
  }
  if ((V->m_ui8Flag & 0x10) != 0) {
    (*(this->m_EntityCapabilities).super_DataTypeBase._vptr_DataTypeBase[3])
              (&this->m_EntityCapabilities,stream);
  }
  if ((V->m_ui8Flag & 0x20) != 0) {
    (*(this->m_VisApp).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_VisApp,stream);
  }
  if ((V->m_ui8Flag & 0x40) != 0) {
    (*(this->m_IRApp).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_IRApp,stream);
  }
  if ((char)V->m_ui8Flag < '\0') {
    if ((V_00->m_ui8Flag & 1) != 0) {
      (*(this->m_EMApp).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_EMApp,stream);
    }
    if ((V_00->m_ui8Flag & 2) != 0) {
      (*(this->m_AudApp).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_AudApp,stream);
      return;
    }
  }
  return;
}

Assistant:

void Appearance_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < APPEARANCE_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    LE_Header::Decode( stream, ignoreHeader );

    // Reset flags
    m_AppearanceFlag1Union.m_ui8Flag = 0;
    m_AppearanceFlag2Union.m_ui8Flag = 0;

    stream >> m_AppearanceFlag1Union.m_ui8Flag;

    if( m_AppearanceFlag1Union.m_ui8Flag2 )
    {
        stream >> m_AppearanceFlag2Union.m_ui8Flag;
    }

    if( m_AppearanceFlag1Union.m_ui8ForceId )
    {
        stream >> m_ui8ForceID;
    }

    if( m_AppearanceFlag1Union.m_ui8Typ )
    {
        stream >> KDIS_STREAM m_EntityType;
    }

    if( m_AppearanceFlag1Union.m_ui8AltTyp )
    {
        stream >> KDIS_STREAM m_AltEntityType;
    }

    if( m_AppearanceFlag1Union.m_ui8Mark )
    {
        stream >> KDIS_STREAM m_EntityMarking;
    }

    if( m_AppearanceFlag1Union.m_ui8Cap )
    {
        stream >> KDIS_STREAM m_EntityCapabilities;
    }

    if( m_AppearanceFlag1Union.m_ui8Vis )
    {
        stream >> KDIS_STREAM m_VisApp;
    }

    if( m_AppearanceFlag1Union.m_ui8IR )
    {
        stream >> KDIS_STREAM m_IRApp;
    }

    if( m_AppearanceFlag1Union.m_ui8Flag2 )
    {
        if( m_AppearanceFlag2Union.m_ui8EM )
        {
            stream >> KDIS_STREAM m_EMApp;
        }

        if( m_AppearanceFlag2Union.m_ui8Audio )
        {
            stream >> KDIS_STREAM m_AudApp;
        }
    }
}